

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O0

void __thiscall Image_CopyRectIn_Test::TestBody(Image_CopyRectIn_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Point2i p;
  WrapMode2D wrapMode;
  WrapMode2D wrapMode_00;
  Point2i p_00;
  Point2i p_01;
  span<const_float> buf_00;
  undefined1 uVar1;
  int iVar3;
  iterator expr2;
  float *val1;
  int *piVar4;
  bool bVar2;
  reference pfVar5;
  int __x;
  Float FVar6;
  float fVar7;
  Bounds2iIterator BVar8;
  Bounds2iIterator BVar9;
  Bounds2iIterator BVar10;
  AssertionResult gtest_ar_1;
  Float qv;
  AssertionResult gtest_ar;
  Float err;
  AssertionResult gtest_ar_;
  int c_1;
  Bounds2iIterator pIter;
  iterator bufIter;
  vector<float,_std::allocator<float>_> buf;
  Bounds2i extent;
  int c;
  int x;
  int y;
  iterator origIter;
  Image image;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  channelNames;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> orig;
  int nc;
  PixelFormat format;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<pbrt::PixelFormat> *__range1;
  RNG rng;
  Point2i res;
  value_type *in_stack_fffffffffffffad8;
  initializer_list<pbrt::PixelFormat> *in_stack_fffffffffffffae0;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffae8;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf8;
  int in_stack_fffffffffffffafc;
  Float in_stack_fffffffffffffb00;
  int in_stack_fffffffffffffb04;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb10;
  Float in_stack_fffffffffffffb14;
  char *in_stack_fffffffffffffb18;
  undefined7 in_stack_fffffffffffffb20;
  undefined1 in_stack_fffffffffffffb27;
  undefined6 in_stack_fffffffffffffb40;
  undefined1 uVar11;
  Bounds2i *in_stack_fffffffffffffb48;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffb50;
  Image *in_stack_fffffffffffffb58;
  int in_stack_fffffffffffffb60;
  WrapMode in_stack_fffffffffffffb64;
  undefined1 *puVar12;
  int in_stack_fffffffffffffb74;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb90;
  int iVar13;
  undefined4 in_stack_fffffffffffffba8;
  PixelFormat PVar14;
  Bounds2i *extent_00;
  Image *this_00;
  Image *this_01;
  Allocator alloc;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffc10;
  Bounds2i *in_stack_fffffffffffffc18;
  Bounds2iIterator channels;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffc20;
  AssertionResult local_3b8;
  Float local_3a4;
  undefined4 local_38c;
  AssertionResult local_388;
  Tuple2<pbrt::Point2,_int> local_370;
  float local_368;
  uint local_364;
  string local_360 [48];
  float *local_330;
  AssertionResult local_328;
  int local_314;
  Bounds2iIterator local_310;
  Bounds2iIterator local_300;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_2f0 [3];
  RNG *local_2d8;
  float *local_2d0;
  float *local_2c8;
  undefined1 local_2b9;
  undefined1 local_2b8 [68];
  int local_274;
  int local_270;
  int local_26c;
  iterator local_268;
  value_type *local_260;
  Tuple2<pbrt::Point2,_int> local_240;
  allocator<char> local_119;
  string local_118 [36];
  int local_f4;
  undefined1 local_ee [21];
  undefined1 local_d9 [9];
  undefined1 local_d0 [32];
  undefined1 local_b0 [108];
  PixelFormat local_44 [3];
  initializer_list<pbrt::PixelFormat> local_38;
  initializer_list<pbrt::PixelFormat> *local_28;
  RNG local_20;
  Tuple2<pbrt::Point2,_int> local_10 [2];
  
  pbrt::Point2<int>::Point2
            ((Point2<int> *)in_stack_fffffffffffffae0,
             (int)((ulong)in_stack_fffffffffffffad8 >> 0x20),(int)in_stack_fffffffffffffad8);
  pbrt::RNG::RNG(&local_20);
  local_44[0] = U256;
  local_44[1] = 1;
  local_44[2] = 2;
  local_38._M_array = local_44;
  local_38._M_len = 3;
  local_28 = &local_38;
  local_b0._96_8_ = std::initializer_list<pbrt::PixelFormat>::begin(local_28);
  local_b0._88_8_ = std::initializer_list<pbrt::PixelFormat>::end(in_stack_fffffffffffffae0);
  channels.bounds = in_stack_fffffffffffffc18;
  channels.p.super_Tuple2<pbrt::Point2,_int> = in_stack_fffffffffffffc10;
  BVar9.bounds = in_stack_fffffffffffffb48;
  BVar9.p.super_Tuple2<pbrt::Point2,_int> = in_stack_fffffffffffffb50;
  BVar10.bounds = (Bounds2i *)in_stack_fffffffffffffae0;
  BVar10.p.super_Tuple2<pbrt::Point2,_int> = in_stack_fffffffffffffae8;
  do {
    if (local_b0._96_8_ == local_b0._88_8_) {
      return;
    }
    local_b0._84_4_ = *(undefined4 *)local_b0._96_8_;
    for (local_b0._80_4_ = 1; (int)local_b0._80_4_ < 4; local_b0._80_4_ = local_b0._80_4_ + 1) {
      local_b0._40_4_ = local_10[0].x;
      local_b0._44_4_ = local_10[0].y;
      GetFloatPixels((Point2i)in_stack_fffffffffffffb78,in_stack_fffffffffffffb74);
      local_ee[1] = 1;
      this_01 = (Image *)local_d0;
      alloc.memoryResource = (memory_resource *)local_d9;
      local_d9._1_8_ = this_01;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20),
                 in_stack_fffffffffffffb18,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
      local_ee[1] = U256 >> 8;
      local_b0._0_8_ = local_d0;
      local_b0._8_8_ = 1;
      this_00 = (Image *)local_ee;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x5c1a22);
      __l._M_len._0_7_ = in_stack_fffffffffffffb20;
      __l._M_array = (iterator)in_stack_fffffffffffffb18;
      __l._M_len._7_1_ = in_stack_fffffffffffffb27;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),__l,
               (allocator_type *)in_stack_fffffffffffffb08);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x5c1a56);
      extent_00 = (Bounds2i *)local_b0;
      do {
        extent_00 = extent_00 + -2;
        std::__cxx11::string::~string((string *)extent_00);
      } while (extent_00 != (Bounds2i *)local_d0);
      std::allocator<char>::~allocator((allocator<char> *)local_d9);
      for (local_f4 = 1; local_f4 < (int)local_b0._80_4_; local_f4 = local_f4 + 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                   CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                   (char)((ulong)in_stack_fffffffffffffaf0._M_current >> 0x38),
                   (allocator<char> *)
                   BVar10.p.super_Tuple2<pbrt::Point2,_int>.super_Tuple2<pbrt::Point2,_int>);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)BVar10.bounds,in_stack_fffffffffffffad8);
        std::__cxx11::string::~string(local_118);
        std::allocator<char>::~allocator(&local_119);
      }
      local_240 = local_10[0];
      PVar14 = local_b0._84_4_;
      pstd::span<std::__cxx11::string_const>::
      span<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffaf0._M_current,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)BVar10.p.super_Tuple2<pbrt::Point2,_int>.super_Tuple2<pbrt::Point2,_int>);
      pbrt::ColorEncodingHandle::ColorEncodingHandle
                ((ColorEncodingHandle *)BVar10.bounds,
                 (ColorEncodingHandle *)in_stack_fffffffffffffad8);
      pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
                ((polymorphic_allocator<std::byte> *)BVar10.bounds);
      in_stack_fffffffffffffad8 = local_260;
      pbrt::Image::Image(this_01,(PixelFormat)((ulong)this_00 >> 0x20),
                         (Point2i)in_stack_fffffffffffffc20,
                         (span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )channels,(ColorEncodingHandle *)extent_00,alloc);
      expr2 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::begin
                        ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                         (local_b0 + 0x30));
      local_26c = 0;
      local_268 = expr2;
      while( true ) {
        iVar13 = local_26c;
        val1 = (float *)pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,1);
        if ((int)*val1 <= iVar13) break;
        local_270 = 0;
        while( true ) {
          iVar13 = local_270;
          piVar4 = pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,0);
          if (*piVar4 <= iVar13) break;
          for (local_274 = 0; local_274 < (int)local_b0._80_4_; local_274 = local_274 + 1) {
            pbrt::Point2<int>::Point2
                      (&(BVar10.bounds)->pMin,(int)((ulong)in_stack_fffffffffffffad8 >> 0x20),
                       (int)in_stack_fffffffffffffad8);
            p.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffffb64;
            p.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffffb60;
            pbrt::Image::SetChannel
                      (in_stack_fffffffffffffb58,p,BVar9.p.super_Tuple2<pbrt::Point2,_int>.y,
                       BVar9.p.super_Tuple2<pbrt::Point2,_int>.x);
            local_268 = local_268 + 1;
          }
          local_270 = local_270 + 1;
        }
        local_26c = local_26c + 1;
      }
      pbrt::Point2<int>::Point2
                (&(BVar10.bounds)->pMin,(int)((ulong)in_stack_fffffffffffffad8 >> 0x20),
                 (int)in_stack_fffffffffffffad8);
      pbrt::Point2<int>::Point2
                (&(BVar10.bounds)->pMin,(int)((ulong)in_stack_fffffffffffffad8 >> 0x20),
                 (int)in_stack_fffffffffffffad8);
      pbrt::Bounds2<int>::Bounds2
                ((Bounds2<int> *)in_stack_fffffffffffffaf0._M_current,
                 (Point2<int> *)
                 BVar10.p.super_Tuple2<pbrt::Point2,_int>.super_Tuple2<pbrt::Point2,_int>,
                 &(BVar10.bounds)->pMin);
      iVar3 = pbrt::Bounds2<int>::Area(BVar10.bounds);
      iVar3 = iVar3 * local_b0._80_4_;
      in_stack_fffffffffffffb74 = iVar3 >> 0x1f;
      in_stack_fffffffffffffb78 = (Tuple2<pbrt::Point2,_int>)&local_2b9;
      std::allocator<float>::allocator((allocator<float> *)0x5c1f79);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)
                 CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                 CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                 (allocator_type *)in_stack_fffffffffffffaf0._M_current);
      std::allocator<float>::~allocator((allocator<float> *)0x5c1fa5);
      puVar12 = local_2b8;
      local_2c8 = (float *)std::vector<float,_std::allocator<float>_>::begin
                                     ((vector<float,_std::allocator<float>_> *)
                                      in_stack_fffffffffffffad8);
      local_2d0 = (float *)std::vector<float,_std::allocator<float>_>::end
                                     ((vector<float,_std::allocator<float>_> *)
                                      in_stack_fffffffffffffad8);
      local_2d8 = &local_20;
      std::
      generate<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,Image_CopyRectIn_Test::TestBody()::__0>
                (in_stack_fffffffffffffaf0,(float *)BVar10.p.super_Tuple2<pbrt::Point2,_int>,
                 (RNG *)BVar10.bounds);
      pstd::span<float_const>::
      span<std::vector<float,std::allocator<float>>,void,std::vector<float,std::allocator<float>>>
                ((span<const_float> *)in_stack_fffffffffffffaf0._M_current,
                 (vector<float,_std::allocator<float>_> *)
                 BVar10.p.super_Tuple2<pbrt::Point2,_int>.super_Tuple2<pbrt::Point2,_int>);
      buf_00.n = (size_t)alloc.memoryResource;
      buf_00.ptr = (float *)this_01;
      pbrt::Image::CopyRectIn(this_00,extent_00,buf_00);
      local_2f0[0]._M_current =
           (float *)std::vector<float,_std::allocator<float>_>::begin
                              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffad8);
      BVar8 = pbrt::begin((Bounds2i *)0x5c2064);
      local_300.bounds = BVar8.bounds;
      in_stack_fffffffffffffb60 = BVar8.p.super_Tuple2<pbrt::Point2,_int>.x;
      in_stack_fffffffffffffb64 = BVar8.p.super_Tuple2<pbrt::Point2,_int>.y;
      while( true ) {
        in_stack_fffffffffffffb58 = (Image *)BVar8.bounds;
        local_300.p = BVar8.p.super_Tuple2<pbrt::Point2,_int>;
        BVar9 = pbrt::end(BVar10.bounds);
        local_310 = BVar9;
        uVar1 = pbrt::Bounds2iIterator::operator!=
                          ((Bounds2iIterator *)in_stack_fffffffffffffaf0._M_current,
                           (Bounds2iIterator *)
                           BVar10.p.super_Tuple2<pbrt::Point2,_int>.super_Tuple2<pbrt::Point2,_int>)
        ;
        if (!(bool)uVar1) break;
        for (local_314 = 0; local_314 < (int)local_b0._80_4_; local_314 = local_314 + 1) {
          local_330 = (float *)std::vector<float,_std::allocator<float>_>::end
                                         ((vector<float,_std::allocator<float>_> *)
                                          in_stack_fffffffffffffad8);
          __gnu_cxx::operator==
                    ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                     BVar10.bounds,
                     (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                     in_stack_fffffffffffffad8);
          testing::AssertionResult::AssertionResult
                    ((AssertionResult *)BVar10.bounds,
                     SUB81((ulong)in_stack_fffffffffffffad8 >> 0x38,0));
          bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_328);
          if (!bVar2) {
            uVar11 = bVar2;
            testing::Message::Message
                      ((Message *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((AssertionResult *)in_stack_fffffffffffffb58,
                       (char *)BVar9.p.super_Tuple2<pbrt::Point2,_int>.
                               super_Tuple2<pbrt::Point2,_int>,(char *)BVar9.bounds,
                       (char *)CONCAT17(uVar1,CONCAT16(uVar11,in_stack_fffffffffffffb40)));
            std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10)
                       ,in_stack_fffffffffffffb08.y,
                       (char *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                       in_stack_fffffffffffffafc,(char *)in_stack_fffffffffffffaf0._M_current);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60)
                       ,(Message *)in_stack_fffffffffffffb58);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)BVar10.bounds);
            std::__cxx11::string::~string(local_360);
            testing::Message::~Message((Message *)0x5c2271);
          }
          local_364 = (uint)!bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c2302);
          if (local_364 != 0) goto LAB_005c27a3;
          if (local_b0._84_4_ == U256) {
            local_370 = (Tuple2<pbrt::Point2,_int>)pbrt::Bounds2iIterator::operator*(&local_300);
            pbrt::WrapMode2D::WrapMode2D
                      ((WrapMode2D *)in_stack_fffffffffffffaf0._M_current,
                       BVar10.p.super_Tuple2<pbrt::Point2,_int>.y);
            p_00.super_Tuple2<pbrt::Point2,_int>.y = iVar3;
            p_00.super_Tuple2<pbrt::Point2,_int>.x = (int)((ulong)puVar12 >> 0x20);
            wrapMode.wrap.values[1] = (WrapMode)puVar12;
            wrapMode.wrap.values[0] = in_stack_fffffffffffffb64;
            FVar6 = pbrt::Image::GetChannel
                              (in_stack_fffffffffffffb58,p_00,
                               BVar9.p.super_Tuple2<pbrt::Point2,_int>.y,wrapMode);
            pfVar5 = __gnu_cxx::
                     __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
                     operator*(local_2f0);
            __x = 0;
            fVar7 = pbrt::Clamp<float,int,int>(*pfVar5,0,1);
            fVar7 = FVar6 - fVar7;
            std::abs(__x);
            local_38c = 0x3b00c24b;
            local_368 = fVar7;
            testing::internal::CmpHelperLT<float,float>
                      ((char *)CONCAT44(PVar14,in_stack_fffffffffffffba8),(char *)expr2,val1,
                       (float *)CONCAT44(iVar13,in_stack_fffffffffffffb90));
            in_stack_fffffffffffffb27 = testing::AssertionResult::operator_cast_to_bool(&local_388);
            if (!(bool)in_stack_fffffffffffffb27) {
              testing::Message::Message
                        ((Message *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
              in_stack_fffffffffffffb18 =
                   testing::AssertionResult::failure_message((AssertionResult *)0x5c247c);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)
                         CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                         in_stack_fffffffffffffb08.y,
                         (char *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                         in_stack_fffffffffffffafc,(char *)in_stack_fffffffffffffaf0._M_current);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)
                         CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                         (Message *)in_stack_fffffffffffffb58);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)BVar10.bounds);
              testing::Message::~Message((Message *)0x5c24d9);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c252e);
          }
          else {
            __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
            operator*(local_2f0);
            in_stack_fffffffffffffb14 =
                 modelQuantization(BVar10.bounds._0_4_,
                                   (PixelFormat)((ulong)in_stack_fffffffffffffad8 >> 0x20));
            local_3a4 = in_stack_fffffffffffffb14;
            in_stack_fffffffffffffb08 =
                 (Tuple2<pbrt::Point2,_int>)pbrt::Bounds2iIterator::operator*(&local_300);
            in_stack_fffffffffffffb04 = local_314;
            pbrt::WrapMode2D::WrapMode2D
                      ((WrapMode2D *)in_stack_fffffffffffffaf0._M_current,
                       BVar10.p.super_Tuple2<pbrt::Point2,_int>.y);
            p_01.super_Tuple2<pbrt::Point2,_int>.y = iVar3;
            p_01.super_Tuple2<pbrt::Point2,_int>.x = (int)((ulong)puVar12 >> 0x20);
            wrapMode_00.wrap.values[1] = (WrapMode)puVar12;
            wrapMode_00.wrap.values[0] = in_stack_fffffffffffffb64;
            in_stack_fffffffffffffb00 =
                 pbrt::Image::GetChannel
                           (in_stack_fffffffffffffb58,p_01,BVar9.p.super_Tuple2<pbrt::Point2,_int>.y
                            ,wrapMode_00);
            testing::internal::EqHelper<false>::Compare<float,float>
                      ((char *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                       (char *)in_stack_fffffffffffffaf0._M_current,
                       (float *)BVar10.p.super_Tuple2<pbrt::Point2,_int>.
                                super_Tuple2<pbrt::Point2,_int>,(float *)BVar10.bounds);
            bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_3b8);
            in_stack_fffffffffffffafc = CONCAT13(bVar2,(int3)in_stack_fffffffffffffafc);
            if (!bVar2) {
              testing::Message::Message
                        ((Message *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
              in_stack_fffffffffffffaf0._M_current =
                   (float *)testing::AssertionResult::failure_message((AssertionResult *)0x5c2675);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)
                         CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                         in_stack_fffffffffffffb08.y,
                         (char *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                         in_stack_fffffffffffffafc,(char *)in_stack_fffffffffffffaf0._M_current);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)
                         CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                         (Message *)in_stack_fffffffffffffb58);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)BVar10.bounds);
              testing::Message::~Message((Message *)0x5c26d2);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c2727);
          }
          __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
          operator++(local_2f0);
        }
        BVar10 = pbrt::Bounds2iIterator::operator++((Bounds2iIterator *)in_stack_fffffffffffffad8);
        BVar8.bounds = (Bounds2i *)in_stack_fffffffffffffb58;
        BVar8.p.super_Tuple2<pbrt::Point2,_int> = local_300.p.super_Tuple2<pbrt::Point2,_int>;
        channels = BVar10;
      }
      local_364 = 0;
LAB_005c27a3:
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffaf0._M_current);
      pbrt::Image::~Image((Image *)BVar10.bounds);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffaf0._M_current);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)BVar10.bounds);
      if (local_364 != 0) {
        return;
      }
    }
    local_b0._96_8_ = local_b0._96_8_ + 4;
  } while( true );
}

Assistant:

TEST(Image, CopyRectIn) {
    Point2i res(17, 32);
    RNG rng;

    for (auto format : {PixelFormat::U256, PixelFormat::Half, PixelFormat::Float}) {
        for (int nc = 1; nc < 4; ++nc) {
            pstd::vector<float> orig = GetFloatPixels(res, nc);

            std::vector<std::string> channelNames = {"A"};
            for (int i = 1; i < nc; ++i)
                channelNames.push_back(std::string(1, 'A' + 1));

            Image image(format, res, channelNames, ColorEncodingHandle::Linear);
            auto origIter = orig.begin();
            for (int y = 0; y < res[1]; ++y)
                for (int x = 0; x < res[0]; ++x)
                    for (int c = 0; c < nc; ++c, ++origIter)
                        image.SetChannel({x, y}, c, *origIter);

            Bounds2i extent(Point2i(10, 23), Point2i(17, 28));
            std::vector<float> buf(extent.Area() * nc);
            std::generate(buf.begin(), buf.end(),
                          [&rng]() { return rng.Uniform<Float>(); });

            image.CopyRectIn(extent, buf);

            // Iterate through the points in the extent and the buffer
            // together.
            auto bufIter = buf.begin();
            for (auto pIter = begin(extent); pIter != end(extent); ++pIter) {
                for (int c = 0; c < nc; ++c) {
                    ASSERT_FALSE(bufIter == buf.end());
                    if (format == PixelFormat::U256) {
                        Float err =
                            std::abs(image.GetChannel(*pIter, c) - Clamp(*bufIter, 0, 1));
                        EXPECT_LT(err, 0.501f / 255.f);
                    } else {
                        Float qv = modelQuantization(*bufIter, format);
                        EXPECT_EQ(qv, image.GetChannel(*pIter, c));
                    }
                    ++bufIter;
                }
            }
        }
    }
}